

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O0

SourceResultType __thiscall
duckdb::PhysicalNestedLoopJoin::GetData
          (PhysicalNestedLoopJoin *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  idx_t iVar1;
  DataChunk *in_RDX;
  DataChunk *in_stack_00000008;
  NestedLoopJoinLocalScanState *lstate;
  NestedLoopJoinGlobalScanState *gstate;
  NestedLoopJoinGlobalState *sink;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  
  unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
  operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
              *)CONCAT17(in_stack_ffffffffffffffc7,
                         CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
  GlobalSinkState::Cast<duckdb::NestedLoopJoinGlobalState>
            ((GlobalSinkState *)
             CONCAT17(in_stack_ffffffffffffffc7,
                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
  GlobalSourceState::Cast<duckdb::NestedLoopJoinGlobalScanState>
            ((GlobalSourceState *)
             CONCAT17(in_stack_ffffffffffffffc7,
                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
  LocalSourceState::Cast<duckdb::NestedLoopJoinLocalScanState>
            ((LocalSourceState *)
             CONCAT17(in_stack_ffffffffffffffc7,
                      CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
  OuterJoinMarker::Scan
            ((OuterJoinMarker *)sink,(OuterJoinGlobalScanState *)gstate,
             (OuterJoinLocalScanState *)lstate,in_stack_00000008);
  iVar1 = DataChunk::size(in_RDX);
  return iVar1 == 0;
}

Assistant:

SourceResultType PhysicalNestedLoopJoin::GetData(ExecutionContext &context, DataChunk &chunk,
                                                 OperatorSourceInput &input) const {
	D_ASSERT(PropagatesBuildSide(join_type));
	// check if we need to scan any unmatched tuples from the RHS for the full/right outer join
	auto &sink = sink_state->Cast<NestedLoopJoinGlobalState>();
	auto &gstate = input.global_state.Cast<NestedLoopJoinGlobalScanState>();
	auto &lstate = input.local_state.Cast<NestedLoopJoinLocalScanState>();

	// if the LHS is exhausted in a FULL/RIGHT OUTER JOIN, we scan chunks we still need to output
	sink.right_outer.Scan(gstate.scan_state, lstate.scan_state, chunk);

	return chunk.size() == 0 ? SourceResultType::FINISHED : SourceResultType::HAVE_MORE_OUTPUT;
}